

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  initializer_list<int> __l;
  vector<int,_std::allocator<int>_> layer_neuron_num;
  Mat input;
  Mat test_label;
  Mat test_input;
  Mat label;
  Net net;
  vector<int,_std::allocator<int>_> local_4f0;
  vector<int,_std::allocator<int>_> local_4d8;
  string local_4c0;
  string local_4a0;
  string local_480;
  allocator_type local_460 [96];
  Mat local_400 [96];
  Mat local_3a0 [96];
  Mat local_340 [96];
  Mat local_2e0 [96];
  Mat local_280 [96];
  Scalar local_220;
  Net local_200;
  
  local_200.layer_neuron_num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x6400000310;
  local_200.layer_neuron_num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 10;
  __l._M_len = 3;
  __l._M_array = (iterator)&local_200;
  std::vector<int,_std::allocator<int>_>::vector(&local_4d8,__l,local_460);
  liu::Net::Net(&local_200);
  std::vector<int,_std::allocator<int>_>::vector(&local_4f0,&local_4d8);
  liu::Net::initNet(&local_200,&local_4f0);
  if (local_4f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_4f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  liu::Net::initWeights(&local_200,0,0.0,0.01);
  local_220.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] = 0.05;
  local_220.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] = 0.0;
  local_220.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] = 0.0;
  local_220.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] = 0.0;
  liu::Net::initBias(&local_200,&local_220);
  cv::Mat::Mat((Mat *)local_460);
  cv::Mat::Mat(local_340);
  cv::Mat::Mat(local_3a0);
  cv::Mat::Mat(local_400);
  local_480._M_dataplus._M_p = (pointer)&local_480.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_480,"data/input_label_1000.xml","");
  liu::get_input_label(&local_480,(Mat *)local_460,local_340,200,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_480._M_dataplus._M_p != &local_480.field_2) {
    operator_delete(local_480._M_dataplus._M_p);
  }
  local_4a0._M_dataplus._M_p = (pointer)&local_4a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_4a0,"data/input_label_1000.xml","");
  liu::get_input_label(&local_4a0,local_3a0,local_400,200,800);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
    operator_delete(local_4a0._M_dataplus._M_p);
  }
  local_200.output_interval = 2;
  local_200.learning_rate = 0.3;
  std::__cxx11::string::_M_replace
            ((ulong)&local_200.activation_function,0,
             (char *)local_200.activation_function._M_string_length,0x10a02e);
  cv::Mat::Mat(local_280,(Mat *)local_460);
  cv::Mat::Mat(local_2e0,local_340);
  liu::Net::train(&local_200,local_280,local_2e0,0.3,true);
  cv::Mat::~Mat(local_2e0);
  cv::Mat::~Mat(local_280);
  liu::Net::test(&local_200,local_3a0,local_400);
  local_4c0._M_dataplus._M_p = (pointer)&local_4c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_4c0,"models/model_sigmoid_800_200_test.xml","");
  liu::Net::save(&local_200,&local_4c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c0._M_dataplus._M_p != &local_4c0.field_2) {
    operator_delete(local_4c0._M_dataplus._M_p);
  }
  getchar();
  cv::Mat::~Mat(local_400);
  cv::Mat::~Mat(local_3a0);
  cv::Mat::~Mat(local_340);
  cv::Mat::~Mat((Mat *)local_460);
  liu::Net::~Net(&local_200);
  if (local_4d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_4d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{
	//Set neuron number of every layer
	vector<int> layer_neuron_num = { 784,100,10 };

	// Initialise Net and weights
	Net net;
	net.initNet(layer_neuron_num);
	net.initWeights(0, 0., 0.01);
	net.initBias(Scalar(0.05));

	//Get test samples and test samples 
	Mat input, label,test_input,test_label;
	int sample_number = 200;
	get_input_label("data/input_label_1000.xml",input, label, sample_number);
	get_input_label("data/input_label_1000.xml", test_input, test_label, 200, 800);

	//Set loss threshold,learning rate and activation function
	float loss_threshold = 0.3;
	net.learning_rate = 0.3;
	net.output_interval = 2;
	net.activation_function = "sigmoid";

	//convert label from 0---1 to -1---1,cause tanh function range is [-1,1]
	//label = 2 * label - 1;

	//Train,and draw the loss curve(cause the last parameter is ture) and test the trained net
	net.train(input, label, loss_threshold,true);
	net.test(test_input, test_label);

	//Save the model
	net.save("models/model_sigmoid_800_200_test.xml");

	getchar();
	return 0;

}